

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O1

unsigned_long PaUtil_CopyInput(PaUtilBufferProcessor *bp,void **buffer,unsigned_long frameCount)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  void *pvVar7;
  PaUtilChannelDescriptor *pPVar8;
  
  pPVar8 = bp->hostInputChannels[0];
  if (bp->hostInputFrameCount[0] < frameCount) {
    frameCount = bp->hostInputFrameCount[0];
  }
  uVar4 = (uint)frameCount;
  if (bp->userInputIsInterleaved == 0) {
    if (bp->inputChannelCount != 0) {
      pvVar7 = *buffer;
      uVar5 = 0;
      do {
        pvVar3 = *(void **)((long)pvVar7 + uVar5 * 8);
        (*bp->inputConverter)(pvVar3,1,pPVar8->data,pPVar8->stride,uVar4,&bp->ditherGenerator);
        *(ulong *)((long)pvVar7 + uVar5 * 8) =
             (ulong)(bp->bytesPerUserInputSample * uVar4) + (long)pvVar3;
        pPVar8->data = (void *)((long)pPVar8->data +
                               (ulong)(pPVar8->stride * uVar4 * bp->bytesPerHostInputSample));
        uVar5 = uVar5 + 1;
        pPVar8 = pPVar8 + 1;
      } while (uVar5 < bp->inputChannelCount);
    }
  }
  else {
    uVar1 = bp->inputChannelCount;
    uVar6 = uVar1;
    if (uVar1 != 0) {
      uVar2 = bp->bytesPerUserInputSample;
      pvVar7 = *buffer;
      uVar5 = 0;
      do {
        (*bp->inputConverter)(pvVar7,uVar1,pPVar8->data,pPVar8->stride,uVar4,&bp->ditherGenerator);
        pvVar7 = (void *)((long)pvVar7 + (ulong)uVar2);
        pPVar8->data = (void *)((long)pPVar8->data +
                               (ulong)(pPVar8->stride * uVar4 * bp->bytesPerHostInputSample));
        uVar5 = uVar5 + 1;
        uVar6 = bp->inputChannelCount;
        pPVar8 = pPVar8 + 1;
      } while (uVar5 < uVar6);
    }
    *buffer = (void *)((long)*buffer + (ulong)(uVar6 * uVar4 * bp->bytesPerUserInputSample));
  }
  bp->hostInputFrameCount[0] = bp->hostInputFrameCount[0] - (frameCount & 0xffffffff);
  return frameCount & 0xffffffff;
}

Assistant:

unsigned long PaUtil_CopyInput( PaUtilBufferProcessor* bp,
        void **buffer, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostInputChannels;
    unsigned int framesToCopy;
    unsigned char *destBytePtr;
    void **nonInterleavedDestPtrs;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    hostInputChannels = bp->hostInputChannels[0];
    framesToCopy = PA_MIN_( bp->hostInputFrameCount[0], frameCount );

    if( bp->userInputIsInterleaved )
    {
        destBytePtr = (unsigned char*)*buffer;
        
        destSampleStrideSamples = bp->inputChannelCount;
        destChannelStrideBytes = bp->bytesPerUserInputSample;

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                hostInputChannels[i].data,
                                hostInputChannels[i].stride,
                                framesToCopy, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next dest channel */

            /* advance source ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    framesToCopy * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        /* advance callers dest pointer (buffer) */
        *buffer = ((unsigned char *)*buffer) +
                framesToCopy * bp->inputChannelCount * bp->bytesPerUserInputSample;
    }
    else
    {
        /* user input is not interleaved */
        
        nonInterleavedDestPtrs = (void**)*buffer;

        destSampleStrideSamples = 1;
        
        for( i=0; i<bp->inputChannelCount; ++i )
        {
            destBytePtr = (unsigned char*)nonInterleavedDestPtrs[i];

            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                hostInputChannels[i].data,
                                hostInputChannels[i].stride,
                                framesToCopy, &bp->ditherGenerator );

            /* advance callers dest pointer (nonInterleavedDestPtrs[i]) */
            destBytePtr += bp->bytesPerUserInputSample * framesToCopy;
            nonInterleavedDestPtrs[i] = destBytePtr;
            
            /* advance source ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    framesToCopy * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }
    }

    bp->hostInputFrameCount[0] -= framesToCopy;
    
    return framesToCopy;
}